

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O2

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  size_t min;
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  char *fmt;
  ssize_t sStack_80;
  uchar props [5];
  ssize_t avail_in;
  void **local_60;
  lzma_filter filters [2];
  ssize_t local_38;
  
  puVar1 = (undefined8 *)self->data;
  lVar4 = puVar1[0x12];
  puVar1[3] = puVar1[0x11];
  puVar1[4] = lVar4;
  local_60 = p;
  do {
    if ((lVar4 == 0) || (*(char *)(puVar1 + 0x14) != '\0')) {
      sStack_80 = puVar1[3] - (long)puVar1[0x11];
      puVar1[0x13] = puVar1[0x13] + sStack_80;
      puVar1[0x16] = puVar1[0x16] + sStack_80;
      if (sStack_80 == 0) {
        *local_60 = (void *)0x0;
        sStack_80 = 0;
      }
      else {
        *local_60 = (void *)puVar1[0x11];
        if (self->code == 9) {
          uVar3 = lzma_crc32(puVar1[0x11],sStack_80,*(undefined4 *)((long)puVar1 + 0xa4));
          *(undefined4 *)((long)puVar1 + 0xa4) = uVar3;
          if (*(char *)(puVar1 + 0x14) != '\0') {
            pvVar6 = self->data;
            min = (ulong)(*(char *)((long)pvVar6 + 0xa2) != '\0') * 8 + 0xc;
            piVar7 = (int *)__archive_read_filter_ahead(self->upstream,min,(ssize_t *)filters);
            if (piVar7 == (int *)0x0 && (long)filters[0].id < 0) {
LAB_00121603:
              sStack_80 = -0x1e;
            }
            else {
              if ((long)filters[0].id < (long)min) {
                fmt = "Lzip: Remaining data is less bytes";
              }
              else if (*(int *)((long)pvVar6 + 0xa4) == *piVar7) {
                if (*(long *)((long)pvVar6 + 0xb0) == *(long *)(piVar7 + 1)) {
                  if ((*(char *)((long)pvVar6 + 0xa2) != '\x01') ||
                     (*(long *)((long)pvVar6 + 0xa8) + min == *(long *)(piVar7 + 3))) {
                    __archive_read_filter_consume(self->upstream,min);
                    iVar2 = lzip_has_member(self->upstream);
                    if (iVar2 == 0) {
                      return sStack_80;
                    }
                    *(undefined2 *)((long)pvVar6 + 0xa0) = 0;
                    *(undefined8 *)((long)pvVar6 + 0xa4) = 0;
                    *(undefined8 *)((long)pvVar6 + 0xac) = 0;
                    *(undefined4 *)((long)pvVar6 + 0xb4) = 0;
                    return sStack_80;
                  }
                  fmt = "Lzip: Member size error";
                }
                else {
                  fmt = "Lzip: Uncompressed size error";
                }
              }
              else {
                fmt = "Lzip: CRC32 error";
              }
              archive_set_error(&self->archive->archive,-1,fmt);
              sStack_80 = -0x19;
            }
          }
        }
      }
      return sStack_80;
    }
    if (*(char *)((long)puVar1 + 0xa1) == '\0') {
      pvVar6 = self->data;
      pvVar5 = __archive_read_filter_ahead(self->upstream,6,&local_38);
      if (pvVar5 != (void *)0x0) {
        *(undefined1 *)((long)pvVar6 + 0xa2) = *(undefined1 *)((long)pvVar5 + 4);
        props[0] = ']';
        uVar8 = *(byte *)((long)pvVar5 + 5) & 0x1f;
        if (0xffffffef < uVar8 - 0x1c) {
          uVar9 = 1 << (sbyte)uVar8;
          iVar2 = (uint)(*(byte *)((long)pvVar5 + 5) >> 5) * (uVar9 >> 4);
          if (uVar8 < 0xd) {
            iVar2 = 0;
          }
          props._1_4_ = uVar9 - iVar2;
          __archive_read_filter_consume(self->upstream,6);
          *(undefined8 *)((long)pvVar6 + 0xa8) = 6;
          filters[0].id = 0x4000000000000001;
          filters[0].options = (void *)0x0;
          filters[1].id = 0xffffffffffffffff;
          filters[1].options = (void *)0x0;
          iVar2 = lzma_properties_decode(filters,0,props,5);
          if ((iVar2 == 0) && (iVar2 = lzma_raw_decoder(pvVar6,filters), iVar2 == 0)) {
            *(undefined1 *)((long)puVar1 + 0xa1) = 1;
            goto LAB_001214ab;
          }
LAB_001215e2:
          set_error(self,iVar2);
        }
      }
      goto LAB_00121603;
    }
LAB_001214ab:
    pvVar6 = __archive_read_filter_ahead(self->upstream,1,&avail_in);
    *puVar1 = pvVar6;
    if (avail_in < 0 && pvVar6 == (void *)0x0) {
      archive_set_error(&self->archive->archive,-1,"truncated input");
      goto LAB_00121603;
    }
    puVar1[1] = avail_in;
    iVar2 = lzma_code(puVar1,(avail_in == 0) * '\x03');
    if (iVar2 != 0) {
      if (iVar2 != 1) goto LAB_001215e2;
      *(undefined1 *)(puVar1 + 0x14) = 1;
    }
    __archive_read_filter_consume(self->upstream,avail_in - puVar1[1]);
    puVar1[0x15] = puVar1[0x15] + (avail_in - puVar1[1]);
    lVar4 = puVar1[4];
  } while( true );
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}